

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Misc.cpp
# Opt level: O2

uint32_t net_uv::net_getAddrPort(sockaddr *addr)

{
  return (uint32_t)(ushort)(*(ushort *)addr->sa_data << 8 | *(ushort *)addr->sa_data >> 8);
}

Assistant:

uint32_t net_getAddrPort(const struct sockaddr* addr)
{
	uint32_t outPort = 0;
	if (addr->sa_family == AF_INET6)
	{
		const struct sockaddr_in6* addr_in = (const struct sockaddr_in6*) addr;
		outPort = ntohs(addr_in->sin6_port);
	}
	else
	{
		const struct sockaddr_in* addr_in = (const struct sockaddr_in*) addr;
		outPort = ntohs(addr_in->sin_port);
	}
	return outPort;
}